

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

char * TextToUpper(char *text)

{
  char cVar1;
  __int32_t **pp_Var2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x400) {
      return TextToUpper::buffer;
    }
    cVar1 = text[lVar3];
    if ((long)cVar1 == 0) break;
    pp_Var2 = __ctype_toupper_loc();
    TextToUpper::buffer[lVar3] = (char)(*pp_Var2)[cVar1];
    lVar3 = lVar3 + 1;
  }
  TextToUpper::buffer[lVar3] = '\0';
  return TextToUpper::buffer;
}

Assistant:

const char *TextToUpper(const char *text)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = { 0 };

    for (int i = 0; i < MAX_TEXT_BUFFER_LENGTH; i++)
    {
        if (text[i] != '\0')
        {
            buffer[i] = (char)toupper(text[i]);
            //if ((text[i] >= 'a') && (text[i] <= 'z')) buffer[i] = text[i] - 32;

            // TODO: Support Utf8 diacritics!
            //if ((text[i] >= 'à') && (text[i] <= 'ý')) buffer[i] = text[i] - 32;
        }
        else { buffer[i] = '\0'; break; }
    }

    return buffer;
}